

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

bool __thiscall PatternBlock::specializes(PatternBlock *this,PatternBlock *op2)

{
  int4 iVar1;
  uintm uVar2;
  uintm uVar3;
  uintm uVar4;
  uintm uVar5;
  int local_3c;
  int4 sbit;
  uintm value2;
  uintm value1;
  uintm mask2;
  uintm mask1;
  int4 tmplength;
  int4 length;
  PatternBlock *op2_local;
  PatternBlock *this_local;
  
  iVar1 = getLength(op2);
  local_3c = 0;
  while( true ) {
    if (iVar1 * 8 <= local_3c) {
      return true;
    }
    mask2 = iVar1 * 8 - local_3c;
    if (0x20 < mask2) {
      mask2 = 0x20;
    }
    uVar2 = getMask(this,local_3c,mask2);
    uVar3 = getValue(this,local_3c,mask2);
    uVar4 = getMask(op2,local_3c,mask2);
    uVar5 = getValue(op2,local_3c,mask2);
    if ((uVar2 & uVar4) != uVar4) break;
    if ((uVar3 & uVar4) != (uVar5 & uVar4)) {
      return false;
    }
    local_3c = mask2 + local_3c;
  }
  return false;
}

Assistant:

bool PatternBlock::specializes(const PatternBlock *op2) const

{				// does every masked bit in -this- match the corresponding
				// masked bit in -op2-
  int4 length = 8*op2->getLength();
  int4 tmplength;
  uintm mask1,mask2,value1,value2;
  int4 sbit = 0;
  while(sbit < length) {
    tmplength = length-sbit;
    if (tmplength > 8*sizeof(uintm))
      tmplength = 8*sizeof(uintm);
    mask1 = getMask(sbit,tmplength);
    value1 = getValue(sbit,tmplength);
    mask2 = op2->getMask(sbit,tmplength);
    value2 = op2->getValue(sbit,tmplength);
    if ((mask1 & mask2) != mask2) return false;
    if ((value1 & mask2) != (value2 & mask2)) return false;
    sbit += tmplength;
  }
  return true;
}